

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

void __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::InputVariablesCannotBeModifiedTest
          (InputVariablesCannotBeModifiedTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"CommonBug_InputVariablesCannotBeModified",
             "Verifies that input variables cannot be modified.");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd4a68;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

InputVariablesCannotBeModifiedTest::InputVariablesCannotBeModifiedTest(deqp::Context& context)
	: TestCase(context, "CommonBug_InputVariablesCannotBeModified", "Verifies that input variables cannot be modified.")
	, m_fs_id(0)
	, m_gs_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank on purpose */
}